

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O2

void Acec_MatchBoxesSort(int *pArray,int nSize,int *pCostLits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  iVar2 = 1;
  if (1 < nSize) {
    iVar2 = nSize;
  }
  uVar8 = 1;
  for (uVar6 = 0; uVar6 != iVar2 - 1; uVar6 = uVar6 + 1) {
    uVar10 = uVar6 & 0xffffffff;
    uVar7 = uVar8;
    while( true ) {
      uVar9 = (uint)uVar10;
      if ((uint)nSize == uVar7) break;
      uVar3 = Abc_Lit2LitL(pCostLits,pArray[uVar7]);
      uVar4 = Abc_Lit2LitL(pCostLits,pArray[(int)uVar9]);
      uVar5 = (uint)uVar7;
      if (uVar3 <= uVar4) {
        uVar5 = uVar9;
      }
      uVar7 = uVar7 + 1;
      uVar10 = (ulong)uVar5;
    }
    iVar1 = pArray[uVar6];
    pArray[uVar6] = pArray[(int)uVar9];
    pArray[(int)uVar9] = iVar1;
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

void Acec_MatchBoxesSort( int * pArray, int nSize, int * pCostLits )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Abc_Lit2LitL(pCostLits, pArray[j]) > Abc_Lit2LitL(pCostLits, pArray[best_i]) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}